

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_compress.c
# Opt level: O0

TIFFCodec * TIFFGetConfiguredCODECs(void)

{
  int iVar1;
  TIFFCodec *pTVar2;
  TIFFCodec *new_codecs;
  TIFFCodec *codecs;
  TIFFCodec *c;
  codec_t *cd;
  TIFFCodec *pTStack_10;
  int i;
  
  cd._4_4_ = 1;
  new_codecs = (TIFFCodec *)0x0;
  for (c = (TIFFCodec *)registeredCODECS; c != (TIFFCodec *)0x0; c = (TIFFCodec *)c->name) {
    pTVar2 = (TIFFCodec *)_TIFFreallocExt((TIFF *)0x0,new_codecs,(long)cd._4_4_ * 0x18);
    if (pTVar2 == (TIFFCodec *)0x0) {
      _TIFFfreeExt((TIFF *)0x0,new_codecs);
      return (TIFFCodec *)0x0;
    }
    _TIFFmemcpy(pTVar2 + (long)cd._4_4_ + -1,*(void **)&c->scheme,0x18);
    cd._4_4_ = cd._4_4_ + 1;
    new_codecs = pTVar2;
  }
  codecs = _TIFFBuiltinCODECS;
  do {
    if (codecs->name == (char *)0x0) {
      pTStack_10 = (TIFFCodec *)_TIFFreallocExt((TIFF *)0x0,new_codecs,(long)cd._4_4_ * 0x18);
      if (pTStack_10 == (TIFFCodec *)0x0) {
        _TIFFfreeExt((TIFF *)0x0,new_codecs);
        pTStack_10 = (TIFFCodec *)0x0;
      }
      else {
        _TIFFmemset(pTStack_10 + (long)cd._4_4_ + -1,0,0x18);
      }
      return pTStack_10;
    }
    iVar1 = TIFFIsCODECConfigured(codecs->scheme);
    if (iVar1 != 0) {
      pTVar2 = (TIFFCodec *)_TIFFreallocExt((TIFF *)0x0,new_codecs,(long)cd._4_4_ * 0x18);
      if (pTVar2 == (TIFFCodec *)0x0) {
        _TIFFfreeExt((TIFF *)0x0,new_codecs);
        return (TIFFCodec *)0x0;
      }
      _TIFFmemcpy(pTVar2 + (long)cd._4_4_ + -1,codecs,0x18);
      cd._4_4_ = cd._4_4_ + 1;
      new_codecs = pTVar2;
    }
    codecs = codecs + 1;
  } while( true );
}

Assistant:

TIFFCodec *TIFFGetConfiguredCODECs()
{
    int i = 1;
    codec_t *cd;
    const TIFFCodec *c;
    TIFFCodec *codecs = NULL;
    TIFFCodec *new_codecs;

    for (cd = registeredCODECS; cd; cd = cd->next)
    {
        new_codecs =
            (TIFFCodec *)_TIFFreallocExt(NULL, codecs, i * sizeof(TIFFCodec));
        if (!new_codecs)
        {
            _TIFFfreeExt(NULL, codecs);
            return NULL;
        }
        codecs = new_codecs;
        _TIFFmemcpy(codecs + i - 1, cd->info, sizeof(TIFFCodec));
        i++;
    }
    for (c = _TIFFBuiltinCODECS; c->name; c++)
    {
        if (TIFFIsCODECConfigured(c->scheme))
        {
            new_codecs = (TIFFCodec *)_TIFFreallocExt(NULL, codecs,
                                                      i * sizeof(TIFFCodec));
            if (!new_codecs)
            {
                _TIFFfreeExt(NULL, codecs);
                return NULL;
            }
            codecs = new_codecs;
            _TIFFmemcpy(codecs + i - 1, (const void *)c, sizeof(TIFFCodec));
            i++;
        }
    }

    new_codecs =
        (TIFFCodec *)_TIFFreallocExt(NULL, codecs, i * sizeof(TIFFCodec));
    if (!new_codecs)
    {
        _TIFFfreeExt(NULL, codecs);
        return NULL;
    }
    codecs = new_codecs;
    _TIFFmemset(codecs + i - 1, 0, sizeof(TIFFCodec));

    return codecs;
}